

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

void __thiscall ThreadContext::InitializePropertyMaps(ThreadContext *this)

{
  Type pRVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  HeapAllocator *alloc;
  BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleHashedEntry,_JsUtil::AsymetricResizeLock>
  *this_00;
  Recycler *alloc_00;
  List<const_Js::PropertyRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar5;
  RecyclableData *pRVar6;
  Type *addr;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  if (this->recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x391,"(this->recycler != nullptr)","this->recycler != nullptr");
    if (!bVar3) goto LAB_007b943d;
    *puVar4 = 0;
  }
  if ((this->recyclableData).ptr == (RecyclableData *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x392,"(this->recyclableData != nullptr)","this->recyclableData != nullptr")
    ;
    if (!bVar3) goto LAB_007b943d;
    *puVar4 = 0;
  }
  if (this->propertyMap != (PropertyMap *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x393,"(this->propertyMap == nullptr)","this->propertyMap == nullptr");
    if (!bVar3) goto LAB_007b943d;
    *puVar4 = 0;
  }
  if (this->caseInvariantPropertySet != (PropertyNoCaseSetType *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x394,"(this->caseInvariantPropertySet == nullptr)",
                       "this->caseInvariantPropertySet == nullptr");
    if (!bVar3) {
LAB_007b943d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  local_50 = (undefined1  [8])
             &JsUtil::
              BaseHashSet<Js::PropertyRecord_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecord_const*,Js::PropertyRecordStringHashComparer,JsUtil::SimpleHashedEntry,JsUtil::AsymetricResizeLock>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_3154530;
  data.filename._0_4_ = 0x398;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_50);
  this_00 = (BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleHashedEntry,_JsUtil::AsymetricResizeLock>
             *)new<Memory::HeapAllocator>(0x78,alloc,0x300d4a);
  JsUtil::
  BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleHashedEntry,_JsUtil::AsymetricResizeLock>
  ::BaseDictionary(this_00,&Memory::HeapAllocator::Instance,0x595);
  this->propertyMap = (PropertyMap *)this_00;
  local_50 = (undefined1  [8])
             &JsUtil::
              List<Js::PropertyRecord_const*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_3154530;
  data.filename._0_4_ = 0x399;
  alloc_00 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
  pLVar5 = (List<const_Js::PropertyRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)new<Memory::Recycler>(0x30,alloc_00,0x38bbb2);
  pRVar1 = this->recycler;
  (pLVar5->super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::Recycler,_DefaultComparer>).buffer
  .ptr = (WriteBarrierPtr<const_Js::PropertyRecord> *)0x0;
  (pLVar5->super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::Recycler,_DefaultComparer>).count
       = 0;
  (pLVar5->super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::Recycler,_DefaultComparer>).alloc
       = pRVar1;
  (pLVar5->super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::Recycler,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014f2590;
  pLVar5->length = 0;
  pLVar5->increment = 4;
  pRVar6 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(&this->recyclableData)
  ;
  addr = &pRVar6->boundPropertyStrings;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = pLVar5;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  memset(this->propertyNamesDirect,0,0x400);
  Js::JavascriptLibrary::InitializeProperties(this);
  (*InitializeAdditionalProperties)(this);
  return;
}

Assistant:

void ThreadContext::InitializePropertyMaps()
{
    Assert(this->recycler != nullptr);
    Assert(this->recyclableData != nullptr);
    Assert(this->propertyMap == nullptr);
    Assert(this->caseInvariantPropertySet == nullptr);

    try
    {
        this->propertyMap = HeapNew(PropertyMap, &HeapAllocator::Instance, TotalNumberOfBuiltInProperties + 700);
        this->recyclableData->boundPropertyStrings = RecyclerNew(this->recycler, JsUtil::List<Js::PropertyRecord const*>, this->recycler);

        memset(propertyNamesDirect, 0, 128*sizeof(Js::PropertyRecord *));

        Js::JavascriptLibrary::InitializeProperties(this);
        InitializeAdditionalProperties(this);

        //Js::JavascriptLibrary::InitializeDOMProperties(this);
    }
    catch(...)
    {
        // Initialization failed, undo what was done above. Callees that throw must clean up after themselves. The recycler will
        // be trashed, so clear members that point to recyclable memory. Stuff in 'recyclableData' will be taken care of by the
        // recycler, and the 'recyclableData' instance will be trashed as well.
        if (this->propertyMap != nullptr)
        {
            HeapDelete(this->propertyMap);
        }
        this->propertyMap = nullptr;

        this->caseInvariantPropertySet = nullptr;
        memset(propertyNamesDirect, 0, 128*sizeof(Js::PropertyRecord *));
        throw;
    }
}